

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Object(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  undefined8 uVar8;
  undefined8 extraout_RAX_00;
  AMFImporter *this_00;
  char *__end;
  uint uVar9;
  ulong uVar10;
  pointer pcVar11;
  string an;
  string id;
  undefined1 local_a0 [56];
  char *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_a0._48_8_ = local_60;
  local_68 = (char *)0x0;
  local_60[0] = 0;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar10 = 0;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar10);
      std::__cxx11::string::string
                ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar5),(allocator *)&local_50);
      iVar5 = std::__cxx11::string::compare((char *)local_a0);
      if (iVar5 != 0) goto LAB_003c3f6d;
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      pcVar3 = local_68;
      strlen((char *)CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::_M_replace
                ((ulong)(local_a0 + 0x30),0,pcVar3,CONCAT44(extraout_var_00,iVar5));
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar4 != uVar9);
  }
  pcVar11 = local_a0 + 0x10;
  local_a0._40_8_ = operator_new(0x50);
  pCVar2 = this->mNodeElement_Cur;
  ((CAMFImporter_NodeElement *)local_a0._40_8_)->Type = 8;
  (((CAMFImporter_NodeElement *)local_a0._40_8_)->ID)._M_dataplus._M_p =
       (pointer)&(((CAMFImporter_NodeElement *)local_a0._40_8_)->ID).field_2;
  (((CAMFImporter_NodeElement *)local_a0._40_8_)->ID)._M_string_length = 0;
  (((CAMFImporter_NodeElement *)local_a0._40_8_)->ID).field_2._M_local_buf[0] = '\0';
  ((CAMFImporter_NodeElement *)local_a0._40_8_)->Parent = pCVar2;
  (((CAMFImporter_NodeElement *)local_a0._40_8_)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       (_List_node_base *)&((CAMFImporter_NodeElement *)local_a0._40_8_)->Child;
  (((CAMFImporter_NodeElement *)local_a0._40_8_)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next =
       (_List_node_base *)&((CAMFImporter_NodeElement *)local_a0._40_8_)->Child;
  (((CAMFImporter_NodeElement *)local_a0._40_8_)->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  ((CAMFImporter_NodeElement *)local_a0._40_8_)->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_00876ed8;
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&((CAMFImporter_NodeElement *)local_a0._40_8_)->ID);
  }
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  pCVar2 = this->mNodeElement_Cur;
  if ((char)iVar5 == '\0') {
    p_Var6 = (_List_node_base *)operator_new(0x18);
    uVar8 = local_a0._40_8_;
    p_Var6[1]._M_next = (_List_node_base *)local_a0._40_8_;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->mNodeElement_Cur = (CAMFImporter_NodeElement *)uVar8;
    local_a0._36_4_ = 0;
LAB_003c3d0a:
    do {
      do {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar5 == '\0') {
          this_00 = (AMFImporter *)local_a0;
          local_a0._0_8_ = pcVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"object","");
          Throw_CloseNotFound(this_00,(string *)local_a0);
LAB_003c3f6d:
          Throw_IncorrectAttr(this,(string *)local_a0);
LAB_003c3f7a:
          local_a0._0_8_ = local_a0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"color","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Only one color can be defined for <object>.","");
          Throw_MoreThanOnceDefined(this,(string *)local_a0,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
            operator_delete((void *)local_a0._0_8_);
          }
          if ((undefined1 *)local_a0._48_8_ != local_60) {
            operator_delete((void *)local_a0._48_8_);
          }
          _Unwind_Resume(extraout_RAX_00);
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar5 == 1) {
          local_a0._0_8_ = pcVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"color","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          uVar7 = std::__cxx11::string::compare((char *)local_a0);
          uVar8 = uVar7;
          if ((pointer)local_a0._0_8_ != pcVar11) {
            operator_delete((void *)local_a0._0_8_);
            uVar8 = extraout_RAX;
          }
          if ((int)uVar7 == 0) {
            if ((local_a0._36_4_ & 1) != 0) goto LAB_003c3f7a;
            local_a0._36_4_ = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
            ParseNode_Color(this);
          }
          else {
            local_a0._0_8_ = pcVar11;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"mesh","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_a0);
            if ((pointer)local_a0._0_8_ != pcVar11) {
              operator_delete((void *)local_a0._0_8_);
            }
            if (iVar5 == 0) {
              ParseNode_Mesh(this);
            }
            else {
              local_a0._0_8_ = pcVar11;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"metadata","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)local_a0);
              if ((pointer)local_a0._0_8_ != pcVar11) {
                operator_delete((void *)local_a0._0_8_);
              }
              if (iVar5 == 0) {
                ParseNode_Metadata(this);
              }
              else {
                local_a0._0_8_ = pcVar11;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"object","");
                XML_CheckNode_SkipUnsupported(this,(string *)local_a0);
                if ((pointer)local_a0._0_8_ != pcVar11) {
                  operator_delete((void *)local_a0._0_8_);
                }
              }
            }
          }
          goto LAB_003c3d0a;
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar5 != 2);
      local_a0._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"object","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar5 = std::__cxx11::string::compare((char *)local_a0);
      if ((pointer)local_a0._0_8_ != pcVar11) {
        operator_delete((void *)local_a0._0_8_);
      }
    } while (iVar5 != 0);
    if (this->mNodeElement_Cur != (CAMFImporter_NodeElement *)0x0) {
      this->mNodeElement_Cur = this->mNodeElement_Cur->Parent;
    }
  }
  else {
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)local_a0._40_8_;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = (_List_node_base *)local_a0._40_8_;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((undefined1 *)local_a0._48_8_ != local_60) {
    operator_delete((void *)local_a0._48_8_);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Object()
{
    std::string id;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <object>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create and if needed - define new geometry object.
	ne = new CAMFImporter_NodeElement_Object(mNodeElement_Cur);

	CAMFImporter_NodeElement_Object& als = *((CAMFImporter_NodeElement_Object*)ne);// alias for convenience

	if(!id.empty()) als.ID = id;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("object");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if color already defined for object.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <object>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("mesh")) { ParseNode_Mesh(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("object");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}